

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall tiger::trains::world::World::~World(World *this)

{
  Player *pPVar1;
  bool bVar2;
  reference ppIVar3;
  reference ppTVar4;
  reference ppPVar5;
  reference ppPVar6;
  reference ppLVar7;
  reference ppIVar8;
  World *in_RDI;
  IEvent *event;
  iterator __end2;
  iterator __begin2;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *__range2;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *eventList
  ;
  iterator __end1_5;
  iterator __begin1_5;
  vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  *__range1_5;
  Line *line;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *__range1_4;
  Point *point;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *__range1_3;
  Player *player;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
  *__range1_2;
  Train *train;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *__range1_1;
  IPost *post;
  const_iterator __end1;
  const_iterator __begin1;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *__range1;
  vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  *in_stack_fffffffffffffeb8;
  Player *in_stack_fffffffffffffec0;
  Point *in_stack_fffffffffffffed0;
  __normal_iterator<tiger::trains::world::IEvent_**,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
  local_d8;
  reference local_d0;
  reference local_c8;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *local_c0;
  __normal_iterator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_*,_std::vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>_>
  local_b8;
  vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  *local_b0;
  Player *local_a8;
  Line **local_a0;
  __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  local_98;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *local_90;
  Point *local_88;
  Point **local_80;
  __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
  local_78;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *local_70;
  Player *local_68;
  Player **local_60;
  __normal_iterator<tiger::trains::world::Player_*const_*,_std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>_>
  local_58;
  vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_> *local_50;
  Train *local_48;
  Train **local_40;
  __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
  local_38;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *local_30;
  IPost *local_28;
  IPost **local_20;
  __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
  local_18;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *local_10;
  
  in_RDI->_vptr_World = (_func_int **)&PTR__World_002d3a90;
  local_10 = getPostList(in_RDI);
  local_18._M_current =
       (IPost **)
       std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::
       begin((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
              *)in_stack_fffffffffffffeb8);
  local_20 = (IPost **)
             std::
             vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::
             end((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                  *)in_stack_fffffffffffffeb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar2) break;
    ppIVar3 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
              ::operator*(&local_18);
    local_28 = *ppIVar3;
    if (local_28 != (IPost *)0x0) {
      (*local_28->_vptr_IPost[1])();
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
    ::operator++(&local_18);
  }
  local_30 = getTrainList(in_RDI);
  local_38._M_current =
       (Train **)
       std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
       begin((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
              *)in_stack_fffffffffffffeb8);
  local_40 = (Train **)
             std::
             vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
             end((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  *)in_stack_fffffffffffffeb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar2) break;
    ppTVar4 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
              ::operator*(&local_38);
    local_48 = *ppTVar4;
    if (local_48 != (Train *)0x0) {
      (*(local_48->super_IUpgradeble)._vptr_IUpgradeble[1])();
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Train_*const_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>
    ::operator++(&local_38);
  }
  local_50 = getPlayerList(in_RDI);
  local_58._M_current =
       (Player **)
       std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
       ::begin((vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                *)in_stack_fffffffffffffeb8);
  local_60 = (Player **)
             std::
             vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
             ::end((vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                    *)in_stack_fffffffffffffeb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<tiger::trains::world::Player_*const_*,_std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<tiger::trains::world::Player_*const_*,_std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar2) break;
    ppPVar5 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Player_*const_*,_std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>_>
              ::operator*(&local_58);
    pPVar1 = *ppPVar5;
    local_68 = pPVar1;
    if (pPVar1 != (Player *)0x0) {
      Player::~Player(in_stack_fffffffffffffec0);
      operator_delete(pPVar1,0x48);
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Player_*const_*,_std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>_>
    ::operator++(&local_58);
  }
  local_70 = getPointList(in_RDI);
  local_78._M_current =
       (Point **)
       std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>::
       begin((vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
              *)in_stack_fffffffffffffeb8);
  local_80 = (Point **)
             std::
             vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>::
             end((vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
                  *)in_stack_fffffffffffffeb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar2) break;
    ppPVar6 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
              ::operator*(&local_78);
    in_stack_fffffffffffffed0 = *ppPVar6;
    local_88 = in_stack_fffffffffffffed0;
    if (in_stack_fffffffffffffed0 != (Point *)0x0) {
      operator_delete(in_stack_fffffffffffffed0,0x18);
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
    ::operator++(&local_78);
  }
  local_90 = getLineList(in_RDI);
  local_98._M_current =
       (Line **)std::
                vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                ::begin((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                         *)in_stack_fffffffffffffeb8);
  local_a0 = (Line **)std::
                      vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                      ::end((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                             *)in_stack_fffffffffffffeb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar2) break;
    ppLVar7 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
              ::operator*(&local_98);
    in_stack_fffffffffffffec0 = (Player *)*ppLVar7;
    local_a8 = in_stack_fffffffffffffec0;
    if (in_stack_fffffffffffffec0 != (Player *)0x0) {
      operator_delete(in_stack_fffffffffffffec0,0x20);
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
    ::operator++(&local_98);
  }
  local_b0 = &in_RDI->eventsHistory;
  local_b8._M_current =
       (vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *)
       std::
       vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
       ::begin(in_stack_fffffffffffffeb8);
  local_c0 = (vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
              *)std::
                vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                ::end(in_stack_fffffffffffffeb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_*,_std::vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>_>
                        *)in_stack_fffffffffffffec0,
                       (__normal_iterator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_*,_std::vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (!bVar2) break;
    local_d0 = __gnu_cxx::
               __normal_iterator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_*,_std::vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>_>
               ::operator*(&local_b8);
    local_c8 = local_d0;
    local_d8._M_current =
         (IEvent **)
         std::
         vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>::
         begin((vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                *)in_stack_fffffffffffffeb8);
    std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>::
    end((vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *)
        in_stack_fffffffffffffeb8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<tiger::trains::world::IEvent_**,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
                          *)in_stack_fffffffffffffec0,
                         (__normal_iterator<tiger::trains::world::IEvent_**,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
                          *)in_stack_fffffffffffffeb8);
      if (!bVar2) break;
      ppIVar8 = __gnu_cxx::
                __normal_iterator<tiger::trains::world::IEvent_**,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
                ::operator*(&local_d8);
      in_stack_fffffffffffffeb8 =
           (vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
            *)*ppIVar8;
      if (in_stack_fffffffffffffeb8 !=
          (vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
           *)0x0) {
        (*(code *)(((in_stack_fffffffffffffeb8->
                    super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish)();
      }
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::IEvent_**,_std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>
      ::operator++(&local_d8);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_*,_std::vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>_>
    ::operator++(&local_b8);
  }
  std::
  vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  ::~vector((vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
             *)in_stack_fffffffffffffed0);
  std::
  map<const_tiger::trains::world::Player_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
  ::~map((map<const_tiger::trains::world::Player_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
          *)0x222298);
  std::
  map<const_tiger::trains::world::Line_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>,_std::less<const_tiger::trains::world::Line_*>,_std::allocator<std::pair<const_tiger::trains::world::Line_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
  ::~map((map<const_tiger::trains::world::Line_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>,_std::less<const_tiger::trains::world::Line_*>,_std::allocator<std::pair<const_tiger::trains::world::Line_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
          *)0x2222a9);
  std::
  map<int,_tiger::trains::world::Point_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
  ::~map((map<int,_tiger::trains::world::Point_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
          *)0x2222ba);
  std::
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  ::~map((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
          *)0x2222cb);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>_>
          *)0x2222dc);
  std::
  map<const_tiger::trains::world::Player_*,_int,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_int>_>_>
  ::~map((map<const_tiger::trains::world::Player_*,_int,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_int>_>_>
          *)0x2222ed);
  std::
  map<const_tiger::trains::world::Point_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>_>_>
  ::~map((map<const_tiger::trains::world::Point_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>_>_>
          *)0x2222fe);
  std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>::~vector
            ((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *)
             in_stack_fffffffffffffed0);
  std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>::
  ~vector((vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *)
          in_stack_fffffffffffffed0);
  std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::
  ~vector((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *)
          in_stack_fffffffffffffed0);
  std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
  ~vector((vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *)
          in_stack_fffffffffffffed0);
  std::vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>::
  ~vector((vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_> *
          )in_stack_fffffffffffffed0);
  std::
  map<int,_tiger::trains::world::Train_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Train_*>_>_>
  ::~map((map<int,_tiger::trains::world::Train_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Train_*>_>_>
          *)0x222364);
  std::
  map<int,_tiger::trains::world::Line_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Line_*>_>_>
  ::~map((map<int,_tiger::trains::world::Line_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Line_*>_>_>
          *)0x222375);
  std::
  map<int,_tiger::trains::world::Point_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
  ::~map((map<int,_tiger::trains::world::Point_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
          *)0x222386);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>_>
          *)0x222397);
  std::
  map<int,_tiger::trains::world::IPost_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::IPost_*>_>_>
  ::~map((map<int,_tiger::trains::world::IPost_*,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::IPost_*>_>_>
          *)0x2223a5);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x2223b3);
  std::
  map<tiger::trains::world::Player_*,_int,_std::less<tiger::trains::world::Player_*>,_std::allocator<std::pair<tiger::trains::world::Player_*const,_int>_>_>
  ::~map((map<tiger::trains::world::Player_*,_int,_std::less<tiger::trains::world::Player_*>,_std::allocator<std::pair<tiger::trains::world::Player_*const,_int>_>_>
          *)0x2223c1);
  return;
}

Assistant:

World::~World()
{
    for (IPost *post : getPostList())
        delete post;

    for (Train *train : getTrainList())
        delete train;

    for (Player *player : getPlayerList())
        delete player;

    for (Point *point : getPointList())
        delete point;

    for (Line *line : getLineList())
        delete line;

    for (std::vector<IEvent *> &eventList : eventsHistory)
        for (IEvent *event : eventList)
            delete event;
}